

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O1

Matrix3x3 *
getAngVelSkewSymmetricMatrixFromMeasurements
          (Matrix3x3 *__return_storage_ptr__,Vector3 meas,Direction *vectorDir,double confidenceMeas
          ,Rotation *R)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  Index col;
  long lVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  Direction va_hat;
  type tmp;
  double local_98 [3];
  Direction local_80;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  iDynTree::Rotation::inverse();
  iDynTree::Rotation::changeCoordFrameOf(&local_80);
  dVar5 = meas.m_data[2] * meas.m_data[2] +
          meas.m_data[1] * meas.m_data[1] + meas.m_data[0] * meas.m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar5;
  auVar4 = sqrtpd(auVar4,auVar4);
  dVar6 = auVar4._0_8_;
  if (((dVar6 != 1.0) || (NAN(dVar6))) && (0.0 < dVar5)) {
    auVar1._8_8_ = dVar6;
    auVar1._0_8_ = dVar6;
    auVar4 = divpd(meas.m_data._0_16_,auVar1);
    meas.m_data[0] = auVar4._0_8_;
    meas.m_data[1] = auVar4._8_8_;
    meas.m_data[2] = meas.m_data[2] / dVar6;
  }
  local_98[2] = local_80.super_Vector3.m_data[2];
  local_98[0] = local_80.super_Vector3.m_data[0];
  local_98[1] = local_80.super_Vector3.m_data[1];
  pdVar2 = &local_58;
  lVar3 = 0;
  do {
    dVar6 = local_98[lVar3];
    pdVar2[-2] = dVar6 * meas.m_data[0];
    pdVar2[-1] = dVar6 * meas.m_data[1];
    *pdVar2 = dVar6 * meas.m_data[2];
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar3 != 3);
  dVar6 = confidenceMeas * 0.5;
  __return_storage_ptr__->m_data[0] = (local_68 - local_68) * dVar6;
  __return_storage_ptr__->m_data[1] = (dStack_50 - dStack_60) * dVar6;
  __return_storage_ptr__->m_data[2] = (local_38 - local_58) * dVar6;
  __return_storage_ptr__->m_data[3] = (dStack_60 - dStack_50) * dVar6;
  __return_storage_ptr__->m_data[4] = (local_48 - local_48) * dVar6;
  __return_storage_ptr__->m_data[5] = (dStack_30 - dStack_40) * dVar6;
  __return_storage_ptr__->m_data[6] = (local_58 - local_38) * dVar6;
  __return_storage_ptr__->m_data[7] = (dStack_40 - dStack_30) * dVar6;
  __return_storage_ptr__->m_data[8] = (local_28 - local_28) * dVar6;
  return __return_storage_ptr__;
}

Assistant:

iDynTree::Matrix3x3 getAngVelSkewSymmetricMatrixFromMeasurements(iDynTree::Vector3 meas, const iDynTree::Direction& vectorDir, double confidenceMeas, const iDynTree::Rotation& R)
{
    using iDynTree::toEigen;

    ///< compute \f$ {{^A}{\hat{R}}_B}^T e_3 \f$ where \f$ e_3 \f$ is the vectorDir
    iDynTree::Direction va_hat = R.inverse().changeCoordFrameOf(vectorDir);
    iDynTree::Vector3 vectorial_estimate = iDynTree::Vector3(va_hat.data(), 3);

    ///< compute vectorial direction from the measurement normalized
    if (toEigen(meas).norm() != 1)
    {
        toEigen(meas).normalize();
    }

    iDynTree::Matrix3x3 Adyn = getMatrixFromVectorVectorMultiplication(meas, vectorial_estimate);
    iDynTree::Matrix3x3 Sdyn;
    auto A(toEigen(Adyn));
    auto S(toEigen(Sdyn));

    S = (A - A.transpose())*(confidenceMeas*0.5);

    return Sdyn;
}